

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# constpool.cpp
# Opt level: O2

void __thiscall asmjit::ConstPool::reset(ConstPool *this,Zone *zone)

{
  size_t *psVar1;
  size_t sVar2;
  long lVar3;
  
  psVar1 = &this->_tree[0]._dataSize;
  this->_zone = zone;
  sVar2 = 1;
  for (lVar3 = 0; lVar3 != 6; lVar3 = lVar3 + 1) {
    ((Tree *)(psVar1 + -2))->_root = (Node *)0x0;
    psVar1[-1] = 0;
    *psVar1 = sVar2;
    this->_gaps[lVar3] = (Gap *)0x0;
    sVar2 = sVar2 * 2;
    psVar1 = psVar1 + 3;
  }
  this->_alignment = 0;
  this->_gapPool = (Gap *)SUB168(ZEXT416(0) << 0x40,0);
  this->_size = SUB168(ZEXT416(0) << 0x40,8);
  return;
}

Assistant:

void ConstPool::reset(Zone* zone) noexcept {
  _zone = zone;

  size_t dataSize = 1;
  for (size_t i = 0; i < ASMJIT_ARRAY_SIZE(_tree); i++) {
    _tree[i].reset();
    _tree[i].setDataSize(dataSize);
    _gaps[i] = nullptr;
    dataSize <<= 1;
  }

  _gapPool = nullptr;
  _size = 0;
  _alignment = 0;
}